

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O1

exr_result_t
exr_decoding_choose_default_routines
          (exr_const_context_t ctxt,int part_index,exr_decode_pipeline_t *decode)

{
  short sVar1;
  ushort uVar2;
  long lVar3;
  exr_coding_channel_info_t *peVar4;
  long lVar5;
  bool bVar6;
  uint sameoutinc;
  uint uVar7;
  exr_result_t eVar8;
  uint uVar9;
  code *UNRECOVERED_JUMPTABLE;
  internal_exr_unpack_fn p_Var10;
  uint uVar11;
  int hastypechange;
  uint uVar12;
  char *pcVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  uint sameoutbpc;
  undefined8 uVar17;
  int simplineoff;
  uint uVar18;
  int iVar19;
  int samebpc;
  long lVar20;
  uint simpinterleave;
  bool bVar21;
  uint local_8c;
  int local_88;
  int local_84;
  uint local_80;
  uint local_7c;
  long local_58;
  int local_48;
  
  if (ctxt == (exr_const_context_t)0x0) {
    return 2;
  }
  if (*ctxt == (_priv_exr_context_t)0x0) {
    if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
      eVar8 = (**(code **)(ctxt + 0x48))
                        (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
      return eVar8;
    }
    if (decode != (exr_decode_pipeline_t *)0x0) {
      if ((decode->context != ctxt) || (decode->part_index != part_index)) {
        eVar8 = (**(code **)(ctxt + 0x48))
                          (ctxt,3,
                           "Cross-wired request for default routines from different context / part",
                           *(code **)(ctxt + 0x48));
        return eVar8;
      }
      lVar3 = *(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
      uVar9 = *(uint *)(lVar3 + 4) & 0xfffffffe;
      bVar6 = 0 < decode->channel_count;
      uVar12 = uVar9;
      if (decode->channel_count < 1) {
        local_84 = 0;
        local_7c = 0xfffffffe;
        local_88 = 0;
        local_80 = 0xfffffffe;
        samebpc = 0;
        sameoutbpc = 0;
        local_48 = 0;
        hastypechange = 0;
        simpinterleave = 0;
        local_8c = 0;
        simplineoff = 0;
        sameoutinc = 0;
      }
      else {
        local_80 = 0xfffffffe;
        lVar20 = 0x28;
        uVar14 = 0;
        local_58 = 0;
        sameoutinc = 0;
        simplineoff = 0;
        local_8c = 0;
        simpinterleave = 0;
        hastypechange = 0;
        local_48 = 0;
        sameoutbpc = 0;
        samebpc = 0;
        local_7c = 0xfffffffe;
        local_88 = 0;
        local_84 = 0;
        do {
          peVar4 = decode->channels;
          bVar21 = false;
          uVar18 = sameoutinc;
          if ((*(int *)((long)peVar4 + lVar20 + -0x20) != 0) &&
             (lVar5 = *(long *)((long)&peVar4->channel_name + lVar20), lVar5 != 0)) {
            sVar1 = *(short *)((long)peVar4 + lVar20 + -0xc);
            uVar11 = (uint)sVar1;
            if ((sVar1 == 2) || (sVar1 == 4)) {
              uVar2 = *(ushort *)((long)peVar4 + lVar20 + -10);
              if (uVar2 < 3) {
                uVar15 = (uint)*(ushort *)((long)peVar4 + lVar20 + -0xe);
                uVar18 = local_7c;
                if (local_7c != uVar15) {
                  uVar18 = 0xffffffff;
                }
                bVar21 = local_7c == 0xfffffffe;
                local_7c = uVar18;
                if (bVar21) {
                  local_7c = uVar15;
                }
                uVar18 = local_80;
                if (local_80 != uVar2) {
                  uVar18 = 0xffffffff;
                }
                bVar21 = local_80 == 0xfffffffe;
                local_80 = uVar18;
                if (bVar21) {
                  local_80 = (uint)uVar2;
                }
                iVar16 = (int)*(char *)((long)peVar4 + lVar20 + -0xf);
                iVar19 = samebpc;
                if (samebpc != iVar16) {
                  iVar19 = -1;
                }
                bVar21 = samebpc == 0;
                samebpc = iVar19;
                if (bVar21) {
                  samebpc = iVar16;
                }
                uVar18 = sameoutbpc;
                if (sameoutbpc != uVar11) {
                  uVar18 = 0xffffffff;
                }
                bVar21 = sameoutbpc == 0;
                sameoutbpc = uVar18;
                if (bVar21) {
                  sameoutbpc = uVar11;
                }
                if ((*(int *)((long)peVar4 + lVar20 + -0x18) != 1) ||
                   (*(int *)((long)peVar4 + lVar20 + -0x14) != 1)) {
                  local_48 = 1;
                }
                uVar15 = *(uint *)((long)peVar4 + lVar20 + -8);
                iVar19 = *(int *)((long)peVar4 + lVar20 + -4);
                iVar16 = simplineoff;
                if (simplineoff != iVar19) {
                  iVar16 = -1;
                }
                bVar21 = simplineoff == 0;
                simplineoff = iVar16;
                if (bVar21) {
                  simplineoff = iVar19;
                }
                uVar18 = uVar15;
                uVar7 = uVar15;
                if (simpinterleave != 0) {
                  uVar18 = simpinterleave;
                  if (lVar5 != (int)((int)uVar14 * uVar11) + local_58) {
                    uVar18 = 0xffffffff;
                  }
                  if ((int)simpinterleave < 1) {
                    uVar18 = simpinterleave;
                  }
                  if ((0 < (int)local_8c) && (lVar5 != local_58 - (int)(uVar11 * (int)uVar14))) {
                    local_8c = 0xffffffff;
                  }
                  uVar7 = local_8c;
                  lVar5 = local_58;
                  if ((int)(local_8c & uVar18) < 0) {
                    local_58 = 0;
                    lVar5 = local_58;
                  }
                }
                local_58 = lVar5;
                local_8c = uVar7;
                simpinterleave = uVar18;
                local_84 = local_84 + 1;
                local_88 = local_88 + (uint)(uVar15 != (int)*(char *)((long)peVar4 + lVar20 + -0xf))
                ;
                hastypechange =
                     hastypechange + (uint)(uVar2 != *(ushort *)((long)peVar4 + lVar20 + -0xe));
                bVar21 = false;
                uVar18 = uVar15;
                if ((sameoutinc != 0) && (uVar18 = sameoutinc, sameoutinc != uVar15)) {
                  uVar18 = 0xffffffff;
                }
                goto LAB_00124d8d;
              }
              uVar17 = *(undefined8 *)((long)peVar4 + lVar20 + -0x28);
              pcVar13 = "Invalid / unsupported output data type (%d) for channel %c (%s)";
              uVar11 = (uint)uVar2;
            }
            else {
              uVar17 = *(undefined8 *)((long)peVar4 + lVar20 + -0x28);
              pcVar13 = "Invalid / unsupported output bytes per element (%d) for channel %c (%s)";
            }
            uVar12 = (**(code **)(ctxt + 0x48))(ctxt,3,pcVar13,uVar11,uVar14 & 0xffffffff,uVar17);
            bVar21 = true;
          }
LAB_00124d8d:
          sameoutinc = uVar18;
          if (bVar21) break;
          uVar14 = uVar14 + 1;
          lVar20 = lVar20 + 0x30;
          bVar6 = (long)uVar14 < (long)decode->channel_count;
        } while ((long)uVar14 < (long)decode->channel_count);
      }
      if (bVar6) {
        return uVar12;
      }
      uVar12 = sameoutbpc * (int)decode->channel_count;
      if (simpinterleave != uVar12) {
        simpinterleave = 0xffffffff;
      }
      uVar18 = 0xffffffff;
      if (local_8c == uVar12) {
        uVar18 = local_8c;
      }
      if ((uVar9 != 2) &&
         ((decode->channel_count == local_84 &&
          ((*(int *)(lVar3 + 0xb0) == 0 && local_88 == 0) && hastypechange == 0)) && 0 < local_84))
      {
        decode->read_fn = read_uncompressed_direct;
        decode->decompress_fn = (_func_exr_result_t__exr_decode_pipeline_ptr *)0x0;
        decode->unpack_and_convert_fn = (_func_exr_result_t__exr_decode_pipeline_ptr *)0x0;
        return 0;
      }
      decode->read_fn = default_read_chunk;
      if (*(int *)(lVar3 + 0xb0) != 0) {
        decode->decompress_fn = default_decompress_chunk;
      }
      p_Var10 = internal_exr_match_decode
                          (decode,(uint)(uVar9 == 2),local_84,local_88,local_7c,local_80,samebpc,
                           sameoutbpc,local_48,hastypechange,sameoutinc,simpinterleave,uVar18,
                           simplineoff);
      decode->unpack_and_convert_fn = (_func_exr_result_t__exr_decode_pipeline_ptr *)p_Var10;
      if (p_Var10 != (internal_exr_unpack_fn)0x0) {
        return 0;
      }
      eVar8 = (**(code **)(ctxt + 0x40))(ctxt,4,"Unable to choose valid unpack routine");
      return eVar8;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar17 = 3;
  }
  else {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar17 = 7;
  }
  eVar8 = (*UNRECOVERED_JUMPTABLE)(ctxt,uVar17);
  return eVar8;
}

Assistant:

exr_result_t
exr_decoding_choose_default_routines (
    exr_const_context_t ctxt, int part_index, exr_decode_pipeline_t* decode)
{
    int32_t isdeep = 0, chanstofill = 0, chanstounpack = 0, sametype = -2,
            sameouttype = -2, samebpc = 0, sameoutbpc = 0, hassampling = 0,
            hastypechange = 0, simpinterleave = 0, simpinterleaverev = 0,
            simplineoff = 0, sameoutinc = 0;
    uint8_t* interleaveptr = NULL;
    EXR_PROMOTE_READ_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);
    if (!decode) return pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT);

    if (decode->context != ctxt || decode->part_index != part_index)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Cross-wired request for default routines from different context / part");

    isdeep = (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
              part->storage_mode == EXR_STORAGE_DEEP_TILED)
                 ? 1
                 : 0;

    for (int c = 0; c < decode->channel_count; ++c)
    {
        exr_coding_channel_info_t* decc = (decode->channels + c);

        if (decc->height == 0 || !decc->decode_to_ptr) continue;

        /*
         * if a user specifies a bad pixel stride / line stride
         * we can't know this realistically, and they may want to
         * use 0 to cause things to collapse for testing purposes
         * so only test the values we know we use for decisions
         */
        if (decc->user_bytes_per_element != 2 &&
            decc->user_bytes_per_element != 4)
            return pctxt->print_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid / unsupported output bytes per element (%d) for channel %c (%s)",
                (int) decc->user_bytes_per_element,
                c,
                decc->channel_name);

        if (decc->user_data_type != (uint16_t) (EXR_PIXEL_HALF) &&
            decc->user_data_type != (uint16_t) (EXR_PIXEL_FLOAT) &&
            decc->user_data_type != (uint16_t) (EXR_PIXEL_UINT))
            return pctxt->print_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid / unsupported output data type (%d) for channel %c (%s)",
                (int) decc->user_data_type,
                c,
                decc->channel_name);

        if (sametype == -2)
            sametype = (int32_t) decc->data_type;
        else if (sametype != (int32_t) decc->data_type)
            sametype = -1;

        if (sameouttype == -2)
            sameouttype = (int32_t) decc->user_data_type;
        else if (sameouttype != (int32_t) decc->user_data_type)
            sameouttype = -1;

        if (samebpc == 0)
            samebpc = decc->bytes_per_element;
        else if (samebpc != decc->bytes_per_element)
            samebpc = -1;

        if (sameoutbpc == 0)
            sameoutbpc = decc->user_bytes_per_element;
        else if (sameoutbpc != decc->user_bytes_per_element)
            sameoutbpc = -1;

        if (decc->x_samples != 1 || decc->y_samples != 1) hassampling = 1;

        ++chanstofill;
        if (decc->user_pixel_stride != decc->bytes_per_element) ++chanstounpack;
        if (decc->user_data_type != decc->data_type) ++hastypechange;

        if (simplineoff == 0)
            simplineoff = decc->user_line_stride;
        else if (simplineoff != decc->user_line_stride)
            simplineoff = -1;

        if (simpinterleave == 0)
        {
            interleaveptr     = decc->decode_to_ptr;
            simpinterleave    = decc->user_pixel_stride;
            simpinterleaverev = decc->user_pixel_stride;
        }
        else
        {
            if (simpinterleave > 0 &&
                decc->decode_to_ptr !=
                    (interleaveptr + c * decc->user_bytes_per_element))
            {
                simpinterleave = -1;
            }
            if (simpinterleaverev > 0 &&
                decc->decode_to_ptr !=
                    (interleaveptr - c * decc->user_bytes_per_element))
            {
                simpinterleaverev = -1;
            }
            if (simpinterleave < 0 && simpinterleaverev < 0)
                interleaveptr = NULL;
        }

        if (sameoutinc == 0)
            sameoutinc = decc->user_pixel_stride;
        else if (sameoutinc != decc->user_pixel_stride)
            sameoutinc = -1;
    }

    if (simpinterleave != sameoutbpc * decode->channel_count)
        simpinterleave = -1;
    if (simpinterleaverev != sameoutbpc * decode->channel_count)
        simpinterleaverev = -1;

    /* special case, uncompressed and reading planar data straight in
     * to all the channels */
    if (!isdeep && part->comp_type == EXR_COMPRESSION_NONE &&
        chanstounpack == 0 && hastypechange == 0 && chanstofill > 0 &&
        chanstofill == decode->channel_count)
    {
        decode->read_fn               = &read_uncompressed_direct;
        decode->decompress_fn         = NULL;
        decode->unpack_and_convert_fn = NULL;
        return EXR_ERR_SUCCESS;
    }
    decode->read_fn = &default_read_chunk;
    if (part->comp_type != EXR_COMPRESSION_NONE)
        decode->decompress_fn = &default_decompress_chunk;

    decode->unpack_and_convert_fn = internal_exr_match_decode (
        decode,
        isdeep,
        chanstofill,
        chanstounpack,
        sametype,
        sameouttype,
        samebpc,
        sameoutbpc,
        hassampling,
        hastypechange,
        sameoutinc,
        simpinterleave,
        simpinterleaverev,
        simplineoff);

    if (!decode->unpack_and_convert_fn)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "Unable to choose valid unpack routine");

    return EXR_ERR_SUCCESS;
}